

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

uint32_t * internal_node_child(char *node,uint32_t child_num)

{
  uint uVar1;
  uint32_t *puVar2;
  uint32_t num_keys;
  uint32_t child_num_local;
  char *node_local;
  
  puVar2 = internal_node_num_keys(node);
  uVar1 = *puVar2;
  if (uVar1 < child_num) {
    printf("Tried to access child_num %d > num_keys %d\n",(ulong)child_num,(ulong)uVar1);
    exit(1);
  }
  if (child_num == uVar1) {
    node_local = (char *)internal_node_right_child(node);
  }
  else {
    node_local = (char *)internal_node_cell(node,child_num);
  }
  return (uint32_t *)node_local;
}

Assistant:

uint32_t *internal_node_child(char *node, uint32_t child_num) {
    uint32_t num_keys = *internal_node_num_keys(node);
    if (child_num > num_keys)
    {
        printf("Tried to access child_num %d > num_keys %d\n", child_num, num_keys);
        exit(EXIT_FAILURE);
    }
    else if (child_num == num_keys)
    {
        return internal_node_right_child(node);
    }
    else
    {
        return internal_node_cell(node, child_num);
    }
}